

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Builder *pBVar1;
  Builder *this_00;
  LocalGet *pLVar2;
  Binary *pBVar3;
  LocalGet *pLVar4;
  Binary *right;
  LocalSet *any;
  Block *pBVar5;
  
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(pBVar1,leftLow,(Type)0x2);
  pBVar3 = Builder::makeBinary(pBVar1,ShrUInt32,(Expression *)pLVar2,(Expression *)widthLessShift);
  pBVar3 = Builder::makeBinary(pBVar1,AndInt32,(Expression *)shiftMask,(Expression *)pBVar3);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(pBVar1,leftHigh,(Type)0x2);
  pLVar4 = Builder::makeLocalGet
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2);
  right = Builder::makeBinary(pBVar1,ShlInt32,(Expression *)pLVar2,(Expression *)pLVar4);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pBVar3 = Builder::makeBinary(pBVar1,OrInt32,(Expression *)pBVar3,(Expression *)right);
  any = Builder::makeLocalSet(pBVar1,highBits,(Expression *)pBVar3);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(this_00,leftLow,(Type)0x2);
  pLVar4 = Builder::makeLocalGet
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2);
  pBVar3 = Builder::makeBinary(this_00,ShlInt32,(Expression *)pLVar2,(Expression *)pLVar4);
  pBVar5 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)pBVar3);
  return pBVar5;
}

Assistant:

Block* makeSmallShl(Index highBits,
                      Index leftLow,
                      Index leftHigh,
                      Index shift,
                      Binary* shiftMask,
                      Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      AndInt32,
      shiftMask,
      builder->makeBinary(
        ShrUInt32, builder->makeLocalGet(leftLow, Type::i32), widthLessShift));
    Binary* shiftHigh =
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits, builder->makeBinary(OrInt32, shiftedInBits, shiftHigh)),
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }